

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O2

int wr_bin_hdr(FILE *fp)

{
  int iVar1;
  uint uVar2;
  int32 iVar3;
  size_t sVar4;
  size_t sVar5;
  char *fmt;
  long lVar6;
  
  iVar1 = fprintf((FILE *)fp,"s3\n");
  if (iVar1 == 3) {
    uVar2 = 0;
    do {
      if (attrib[uVar2] == (char *)0x0) {
        lVar6 = ftell((FILE *)fp);
        uVar2 = (int)lVar6 - 1U & 7;
        if (uVar2 != 0) {
          fwrite("        ",1,8 - (ulong)uVar2,(FILE *)fp);
        }
        iVar1 = fprintf((FILE *)fp,"endhdr\n");
        if (iVar1 == 7) {
          iVar3 = swap_stamp(fp);
          if (iVar3 != 0) {
            return -1;
          }
          return 0;
        }
        fmt = "Error while endhdr marker\n";
        lVar6 = 0xe1;
        goto LAB_001077be;
      }
      iVar1 = fprintf((FILE *)fp,"%s %s\n",attrib[uVar2],value[uVar2]);
      sVar4 = strlen(attrib[uVar2]);
      sVar5 = strlen(value[uVar2]);
      uVar2 = uVar2 + 1;
    } while (sVar4 + sVar5 + 2 == (long)iVar1);
    fmt = "Error while attrib/value pair\n";
    lVar6 = 0xd2;
  }
  else {
    fmt = "Error while writing SPHINX-III ID\n";
    lVar6 = 0xca;
  }
LAB_001077be:
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                 ,lVar6,fmt);
  return -1;
}

Assistant:

static int
wr_bin_hdr(FILE *fp)
{
    uint32 i;
    long padding;
    int ret;

    if (fprintf(fp, "s3\n") != 3) {
	E_ERROR_SYSTEM("Error while writing SPHINX-III ID\n");
	goto error_loc;
    }

    for (i = 0; attrib[i]; i++) {
	ret = fprintf(fp, "%s %s\n", attrib[i], value[i]);
	if (ret != (strlen(attrib[i]) + 
		    strlen(value[i]) + 2)) {
	    E_ERROR_SYSTEM("Error while attrib/value pair\n");
	    goto error_loc;
	}
    }

    /* Align to an 8-byte boundary (guarantees natural alignment for
     * whatever follows) */
    padding = ftell(fp) + strlen("endhdr\n");
    padding = 8 - (padding & 7);
    if (padding != 8) {
	fwrite("        ", 1, padding, fp);
    }

    ret = fprintf(fp, "endhdr\n");
    if (ret != strlen("endhdr\n")) {
	E_ERROR_SYSTEM("Error while endhdr marker\n");
	goto error_loc;
    }

    if (swap_stamp(fp) != S3_SUCCESS) {
	goto error_loc;
    }

    return S3_SUCCESS;

error_loc:
    return S3_ERROR;
}